

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

void __thiscall ON_String::MakeUpperOrdinal(ON_String *this)

{
  int element_count;
  int length;
  ON_String *this_local;
  
  CopyArray(this);
  element_count = Length(this);
  if (0 < element_count) {
    MapStringOrdinal(UpperOrdinal,this->m_s,element_count,this->m_s,element_count);
  }
  return;
}

Assistant:

void ON_String::MakeUpperOrdinal()
{
 	CopyArray();
  const int length = Length();
  if (length > 0)
    ON_String::MapStringOrdinal(
    ON_StringMapOrdinalType::UpperOrdinal,
    m_s,
    length,
    m_s,
    length
    );
}